

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::_::CidrRange>::~ArrayBuilder(ArrayBuilder<kj::_::CidrRange> *this)

{
  CidrRange *pCVar1;
  RemoveConst<kj::_::CidrRange> *pRVar2;
  CidrRange *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CidrRange *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->ptr = (CidrRange *)0x0;
    this->pos = (RemoveConst<kj::_::CidrRange> *)0x0;
    this->endPtr = (CidrRange *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,0x18,((long)pRVar2 - (long)pCVar1 >> 3) * -0x5555555555555555,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }